

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall
icu_63::UVector::sortedInsert(UVector *this,UElement e,UElementComparator *compare,UErrorCode *ec)

{
  int8_t iVar1;
  UBool UVar2;
  int32_t iVar3;
  int local_4c;
  int32_t i;
  int iStack_30;
  int8_t c;
  int32_t probe;
  int32_t max;
  int32_t min;
  UErrorCode *ec_local;
  UElementComparator *compare_local;
  UVector *this_local;
  UElement e_local;
  
  probe = 0;
  iVar3 = this->count;
  while (iStack_30 = iVar3, probe != iStack_30) {
    iVar3 = (probe + iStack_30) / 2;
    iVar1 = (*compare)((UElement)this->elements[iVar3].pointer,(UElement)e.pointer);
    if (iVar1 < '\x01') {
      probe = iVar3 + 1;
      iVar3 = iStack_30;
    }
  }
  UVar2 = ensureCapacity(this,this->count + 1,ec);
  if (UVar2 != '\0') {
    for (local_4c = this->count; probe < local_4c; local_4c = local_4c + -1) {
      this->elements[local_4c] = this->elements[local_4c + -1];
    }
    this->elements[probe] = e;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::sortedInsert(UElement e, UElementComparator *compare, UErrorCode& ec) {
    // Perform a binary search for the location to insert tok at.  Tok
    // will be inserted between two elements a and b such that a <=
    // tok && tok < b, where there is a 'virtual' elements[-1] always
    // less than tok and a 'virtual' elements[count] always greater
    // than tok.
    int32_t min = 0, max = count;
    while (min != max) {
        int32_t probe = (min + max) / 2;
        int8_t c = (*compare)(elements[probe], e);
        if (c > 0) {
            max = probe;
        } else {
            // assert(c <= 0);
            min = probe + 1;
        }
    }
    if (ensureCapacity(count + 1, ec)) {
        for (int32_t i=count; i>min; --i) {
            elements[i] = elements[i-1];
        }
        elements[min] = e;
        ++count;
    }
}